

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration.cpp
# Opt level: O1

QOffscreenIntegration * QOffscreenIntegration::createOffscreenIntegration(QStringList *paramList)

{
  QOffscreenIntegration *this;
  long in_FS_OFFSET;
  QArrayData *local_38;
  undefined8 uStack_30;
  long local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = -0x5555555555555556;
  local_38 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  uStack_30 = 0xaaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_38);
  if (local_28 == 0) {
    this = (QOffscreenIntegration *)operator_new(0x58);
    QOffscreenX11Integration::QOffscreenX11Integration((QOffscreenX11Integration *)this,paramList);
  }
  else {
    this = (QOffscreenIntegration *)0x0;
  }
  if (this == (QOffscreenIntegration *)0x0) {
    this = (QOffscreenIntegration *)operator_new(0x58);
    QOffscreenIntegration(this,paramList);
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QOffscreenIntegration *QOffscreenIntegration::createOffscreenIntegration(const QStringList& paramList)
{
    QOffscreenIntegration *offscreenIntegration = nullptr;

#if QT_CONFIG(xlib) && QT_CONFIG(opengl) && !QT_CONFIG(opengles2)
    QByteArray glx = qgetenv("QT_QPA_OFFSCREEN_NO_GLX");
    if (glx.isEmpty())
        offscreenIntegration = new QOffscreenX11Integration(paramList);
#endif

     if (!offscreenIntegration)
        offscreenIntegration = new QOffscreenIntegration(paramList);
    return offscreenIntegration;
}